

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test::
DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test
          (DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test *this)

{
  DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DescriptorPoolDatabaseTest_StripSourceCodeInfo_Test_029a4920;
  return;
}

Assistant:

TEST(DescriptorPoolDatabaseTest, StripSourceCodeInfo) {
  SimpleDescriptorDatabase original_db;
  AddToDatabase(&original_db, R"pb(
    name: "foo.proto"
    package: "foo"
    message_type {
      name: "Foo"
      extension_range { start: 1 end: 100 }
    }
    extension {
      name: "foo_ext"
      extendee: ".foo.Foo"
      number: 3
      label: LABEL_OPTIONAL
      type: TYPE_INT32
    }
    source_code_info { location { leading_detached_comments: "comment" } }
  )pb");
  DescriptorPool pool(&original_db);
  DescriptorPoolDatabase db(pool);

  FileDescriptorProto file;
  ASSERT_TRUE(db.FindFileByName("foo.proto", &file));
  EXPECT_FALSE(file.has_source_code_info());

  ASSERT_TRUE(db.FindFileContainingExtension("foo.Foo", 3, &file));
  EXPECT_FALSE(file.has_source_code_info());

  ASSERT_TRUE(db.FindFileContainingSymbol("foo.Foo", &file));
  EXPECT_FALSE(file.has_source_code_info());
}